

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int uv__signal_lock(void)

{
  long lVar1;
  int iVar2;
  long in_RAX;
  ssize_t sVar3;
  int *piVar4;
  char data;
  int r;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX;
  do {
    sVar3 = read(uv__signal_lock_pipefd[0],(void *)((long)&uStack_8 + 3),1);
    lVar1 = uStack_8;
    uStack_8 = CONCAT44((int)sVar3,(undefined4)uStack_8);
    uStack_8._0_2_ = (ushort)lVar1;
    uStack_8._0_3_ = (uint3)(ushort)uStack_8;
    if ((int)sVar3 < 0) {
      piVar4 = __errno_location();
      uStack_8._0_3_ = CONCAT12(*piVar4 == 4,(ushort)uStack_8);
    }
  } while (uStack_8._2_1_ != '\0');
  iVar2 = 0;
  if (uStack_8 < 0) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int uv__signal_lock(void) {
  int r;
  char data;

  do {
    r = read(uv__signal_lock_pipefd[0], &data, sizeof data);
  } while (r < 0 && errno == EINTR);

  return (r < 0) ? -1 : 0;
}